

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O0

void idct64_stage8_avx2(__m256i *u,__m256i *cospim32,__m256i *cospi32,__m256i *cospim16,
                       __m256i *cospi48,__m256i *cospi16,__m256i *cospim48,__m256i *clamp_lo,
                       __m256i *clamp_hi,__m256i *rnding,int bit)

{
  __m256i in1;
  __m256i in1_00;
  __m256i in0;
  __m256i in0_00;
  undefined8 *puVar1;
  long in_RDI;
  __m256i *in_XMM0_Qa;
  __m256i *palVar2;
  __m256i *palVar3;
  __m256i *palVar4;
  __m256i *in_XMM0_Qb;
  __m256i *palVar5;
  __m256i *palVar6;
  __m256i *palVar7;
  __m256i *in_YMM0_H;
  __m256i *palVar8;
  __m256i *palVar9;
  __m256i *palVar10;
  __m256i *in_register_00001218;
  __m256i *palVar11;
  __m256i *n1;
  __m256i temp2;
  __m256i temp1;
  int i;
  __m256i *in_stack_ffffffffffffff38;
  __m256i *palVar12;
  __m256i *palVar13;
  undefined8 in_stack_ffffffffffffff48;
  int bit_00;
  __m256i *palVar14;
  __m256i *in_stack_ffffffffffffff50;
  __m256i *palVar15;
  __m256i *in_stack_ffffffffffffff58;
  __m256i *palVar16;
  __m256i *in_stack_ffffffffffffff60;
  __m256i *palVar17;
  __m256i *in_stack_ffffffffffffff68;
  __m256i *palVar18;
  __m256i *in_stack_ffffffffffffff70;
  __m256i *palVar19;
  __m256i *palVar20;
  undefined1 in_stack_ffffffffffffff80 [24];
  uint local_64;
  
  bit_00 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  half_btf_avx2(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,bit_00);
  palVar2 = in_XMM0_Qa;
  palVar5 = in_XMM0_Qb;
  palVar8 = in_YMM0_H;
  palVar11 = in_register_00001218;
  half_btf_avx2(in_YMM0_H,in_XMM0_Qb,in_XMM0_Qa,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                bit_00);
  *(__m256i **)(in_RDI + 0x1a0) = in_XMM0_Qa;
  *(__m256i **)(in_RDI + 0x1a8) = in_XMM0_Qb;
  *(__m256i **)(in_RDI + 0x1b0) = in_YMM0_H;
  *(__m256i **)(in_RDI + 0x1b8) = in_register_00001218;
  *(__m256i **)(in_RDI + 0x140) = palVar2;
  *(__m256i **)(in_RDI + 0x148) = palVar5;
  *(__m256i **)(in_RDI + 0x150) = palVar8;
  *(__m256i **)(in_RDI + 0x158) = palVar11;
  palVar3 = palVar2;
  palVar6 = palVar5;
  palVar9 = palVar8;
  palVar12 = palVar11;
  half_btf_avx2(palVar8,palVar5,palVar2,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,bit_00);
  palVar4 = palVar2;
  palVar7 = palVar5;
  palVar10 = palVar8;
  n1 = palVar11;
  half_btf_avx2(palVar9,palVar6,palVar3,palVar11,palVar8,(int)((ulong)palVar5 >> 0x20));
  *(__m256i **)(in_RDI + 0x180) = palVar2;
  *(__m256i **)(in_RDI + 0x188) = palVar5;
  *(__m256i **)(in_RDI + 400) = palVar8;
  *(__m256i **)(in_RDI + 0x198) = palVar11;
  *(__m256i **)(in_RDI + 0x160) = palVar4;
  *(__m256i **)(in_RDI + 0x168) = palVar7;
  *(__m256i **)(in_RDI + 0x170) = palVar10;
  *(__m256i **)(in_RDI + 0x178) = n1;
  palVar2 = palVar4;
  palVar5 = palVar7;
  palVar8 = palVar10;
  palVar11 = n1;
  for (local_64 = 0x10; (int)local_64 < 0x14; local_64 = local_64 + 1) {
    in0[1] = in_stack_ffffffffffffff80._0_8_;
    in0[2] = in_stack_ffffffffffffff80._8_8_;
    in0[3] = in_stack_ffffffffffffff80._16_8_;
    in0[0] = (longlong)palVar12;
    in1[1] = (longlong)palVar3;
    in1[0] = (longlong)palVar11;
    in1[2] = (longlong)palVar6;
    in1[3] = (longlong)palVar9;
    addsub_avx2(in0,in1,palVar8,palVar5,palVar2,in_stack_ffffffffffffff38);
    puVar1 = (undefined8 *)(in_RDI + (long)(int)(local_64 ^ 0xf) * 0x20);
    palVar4 = (__m256i *)*puVar1;
    palVar7 = (__m256i *)puVar1[1];
    palVar10 = (__m256i *)puVar1[2];
    n1 = (__m256i *)puVar1[3];
    in0_00[1] = in_stack_ffffffffffffff80._0_8_;
    in0_00[2] = in_stack_ffffffffffffff80._8_8_;
    in0_00[3] = in_stack_ffffffffffffff80._16_8_;
    in0_00[0] = (longlong)palVar12;
    in1_00[1] = (longlong)palVar3;
    in1_00[0] = (longlong)palVar11;
    in1_00[2] = (longlong)palVar6;
    in1_00[3] = (longlong)palVar9;
    addsub_avx2(in0_00,in1_00,palVar8,palVar5,palVar2,in_stack_ffffffffffffff38);
  }
  half_btf_avx2(palVar9,palVar6,palVar3,palVar11,palVar8,(int)((ulong)palVar5 >> 0x20));
  palVar17 = palVar4;
  palVar18 = palVar7;
  palVar19 = palVar10;
  palVar20 = n1;
  half_btf_avx2(palVar10,palVar7,palVar4,palVar11,palVar8,(int)((ulong)palVar5 >> 0x20));
  palVar13 = palVar4;
  palVar14 = palVar7;
  palVar15 = palVar10;
  palVar16 = n1;
  half_btf_avx2(palVar19,palVar18,palVar17,n1,palVar10,(int)((ulong)palVar7 >> 0x20));
  palVar3 = palVar4;
  palVar6 = palVar7;
  palVar9 = palVar10;
  palVar12 = n1;
  half_btf_avx2(palVar19,palVar18,palVar17,palVar16,palVar15,(int)((ulong)palVar14 >> 0x20));
  palVar2 = palVar3;
  palVar5 = palVar6;
  palVar8 = palVar9;
  palVar11 = n1;
  half_btf_avx2(palVar19,palVar18,palVar17,palVar16,palVar15,(int)((ulong)palVar14 >> 0x20));
  *(__m256i **)(in_RDI + 0x700) = palVar2;
  *(__m256i **)(in_RDI + 0x708) = palVar5;
  *(__m256i **)(in_RDI + 0x710) = palVar8;
  *(__m256i **)(in_RDI + 0x718) = palVar11;
  half_btf_avx2(palVar19,palVar18,palVar17,palVar16,palVar15,(int)((ulong)palVar14 >> 0x20));
  *(__m256i **)(in_RDI + 0x720) = palVar2;
  *(__m256i **)(in_RDI + 0x728) = palVar5;
  *(__m256i **)(in_RDI + 0x730) = palVar8;
  *(__m256i **)(in_RDI + 0x738) = palVar11;
  half_btf_avx2(palVar19,palVar18,palVar17,palVar16,palVar15,(int)((ulong)palVar14 >> 0x20));
  *(__m256i **)(in_RDI + 0x740) = palVar2;
  *(__m256i **)(in_RDI + 0x748) = palVar5;
  *(__m256i **)(in_RDI + 0x750) = palVar8;
  *(__m256i **)(in_RDI + 0x758) = palVar11;
  half_btf_avx2(palVar19,palVar18,palVar17,palVar16,palVar15,(int)((ulong)palVar14 >> 0x20));
  *(__m256i **)(in_RDI + 0x760) = palVar2;
  *(__m256i **)(in_RDI + 0x768) = palVar5;
  *(__m256i **)(in_RDI + 0x770) = palVar8;
  *(__m256i **)(in_RDI + 0x778) = palVar11;
  *(__m256i **)(in_RDI + 0x480) = palVar17;
  *(__m256i **)(in_RDI + 0x488) = palVar18;
  *(__m256i **)(in_RDI + 0x490) = palVar19;
  *(__m256i **)(in_RDI + 0x498) = palVar20;
  *(__m256i **)(in_RDI + 0x4a0) = palVar13;
  *(__m256i **)(in_RDI + 0x4a8) = palVar14;
  *(__m256i **)(in_RDI + 0x4b0) = palVar15;
  *(__m256i **)(in_RDI + 0x4b8) = palVar16;
  *(__m256i **)(in_RDI + 0x4c0) = palVar4;
  *(__m256i **)(in_RDI + 0x4c8) = palVar7;
  *(__m256i **)(in_RDI + 0x4d0) = palVar10;
  *(__m256i **)(in_RDI + 0x4d8) = palVar12;
  *(__m256i **)(in_RDI + 0x4e0) = palVar3;
  *(__m256i **)(in_RDI + 0x4e8) = palVar6;
  *(__m256i **)(in_RDI + 0x4f0) = palVar9;
  *(__m256i **)(in_RDI + 0x4f8) = n1;
  half_btf_avx2(palVar19,palVar18,palVar17,palVar16,palVar15,(int)((ulong)palVar14 >> 0x20));
  palVar17 = palVar3;
  palVar18 = palVar6;
  palVar19 = palVar9;
  palVar20 = n1;
  half_btf_avx2(palVar9,palVar6,palVar3,palVar16,palVar15,(int)((ulong)palVar14 >> 0x20));
  palVar13 = palVar3;
  palVar14 = palVar6;
  palVar15 = palVar9;
  palVar16 = n1;
  half_btf_avx2(palVar19,palVar18,palVar17,n1,palVar9,(int)((ulong)palVar6 >> 0x20));
  palVar4 = palVar3;
  palVar7 = palVar6;
  palVar10 = palVar9;
  palVar12 = n1;
  half_btf_avx2(palVar19,palVar18,palVar17,palVar16,palVar15,(int)((ulong)palVar14 >> 0x20));
  palVar2 = palVar4;
  palVar5 = palVar7;
  palVar8 = palVar10;
  palVar11 = n1;
  half_btf_avx2(palVar19,palVar18,palVar17,palVar16,palVar15,(int)((ulong)palVar14 >> 0x20));
  *(__m256i **)(in_RDI + 0x680) = palVar2;
  *(__m256i **)(in_RDI + 0x688) = palVar5;
  *(__m256i **)(in_RDI + 0x690) = palVar8;
  *(__m256i **)(in_RDI + 0x698) = palVar11;
  half_btf_avx2(palVar19,palVar18,palVar17,palVar16,palVar15,(int)((ulong)palVar14 >> 0x20));
  *(__m256i **)(in_RDI + 0x6a0) = palVar2;
  *(__m256i **)(in_RDI + 0x6a8) = palVar5;
  *(__m256i **)(in_RDI + 0x6b0) = palVar8;
  *(__m256i **)(in_RDI + 0x6b8) = palVar11;
  half_btf_avx2(palVar19,palVar18,palVar17,palVar16,palVar15,(int)((ulong)palVar14 >> 0x20));
  *(__m256i **)(in_RDI + 0x6c0) = palVar2;
  *(__m256i **)(in_RDI + 0x6c8) = palVar5;
  *(__m256i **)(in_RDI + 0x6d0) = palVar8;
  *(__m256i **)(in_RDI + 0x6d8) = palVar11;
  half_btf_avx2(palVar19,palVar18,palVar17,palVar16,palVar15,(int)((ulong)palVar14 >> 0x20));
  *(__m256i **)(in_RDI + 0x6e0) = palVar2;
  *(__m256i **)(in_RDI + 0x6e8) = palVar5;
  *(__m256i **)(in_RDI + 0x6f0) = palVar8;
  *(__m256i **)(in_RDI + 0x6f8) = palVar11;
  *(__m256i **)(in_RDI + 0x500) = palVar17;
  *(__m256i **)(in_RDI + 0x508) = palVar18;
  *(__m256i **)(in_RDI + 0x510) = palVar19;
  *(__m256i **)(in_RDI + 0x518) = palVar20;
  *(__m256i **)(in_RDI + 0x520) = palVar13;
  *(__m256i **)(in_RDI + 0x528) = palVar14;
  *(__m256i **)(in_RDI + 0x530) = palVar15;
  *(__m256i **)(in_RDI + 0x538) = palVar16;
  *(__m256i **)(in_RDI + 0x540) = palVar3;
  *(__m256i **)(in_RDI + 0x548) = palVar6;
  *(__m256i **)(in_RDI + 0x550) = palVar9;
  *(__m256i **)(in_RDI + 0x558) = palVar12;
  *(__m256i **)(in_RDI + 0x560) = palVar4;
  *(__m256i **)(in_RDI + 0x568) = palVar7;
  *(__m256i **)(in_RDI + 0x570) = palVar10;
  *(__m256i **)(in_RDI + 0x578) = n1;
  return;
}

Assistant:

static inline void idct64_stage8_avx2(
    __m256i *u, const __m256i *cospim32, const __m256i *cospi32,
    const __m256i *cospim16, const __m256i *cospi48, const __m256i *cospi16,
    const __m256i *cospim48, const __m256i *clamp_lo, const __m256i *clamp_hi,
    const __m256i *rnding, int bit) {
  int i;
  __m256i temp1, temp2, temp3, temp4;
  temp1 = half_btf_avx2(cospim32, &u[10], cospi32, &u[13], rnding, bit);
  u[13] = half_btf_avx2(cospi32, &u[10], cospi32, &u[13], rnding, bit);
  u[10] = temp1;
  temp2 = half_btf_avx2(cospim32, &u[11], cospi32, &u[12], rnding, bit);
  u[12] = half_btf_avx2(cospi32, &u[11], cospi32, &u[12], rnding, bit);
  u[11] = temp2;

  for (i = 16; i < 20; ++i) {
    addsub_avx2(u[i], u[i ^ 7], &u[i], &u[i ^ 7], clamp_lo, clamp_hi);
    addsub_avx2(u[i ^ 15], u[i ^ 8], &u[i ^ 15], &u[i ^ 8], clamp_lo, clamp_hi);
  }

  temp1 = half_btf_avx2(cospim16, &u[36], cospi48, &u[59], rnding, bit);
  temp2 = half_btf_avx2(cospim16, &u[37], cospi48, &u[58], rnding, bit);
  temp3 = half_btf_avx2(cospim16, &u[38], cospi48, &u[57], rnding, bit);
  temp4 = half_btf_avx2(cospim16, &u[39], cospi48, &u[56], rnding, bit);
  u[56] = half_btf_avx2(cospi48, &u[39], cospi16, &u[56], rnding, bit);
  u[57] = half_btf_avx2(cospi48, &u[38], cospi16, &u[57], rnding, bit);
  u[58] = half_btf_avx2(cospi48, &u[37], cospi16, &u[58], rnding, bit);
  u[59] = half_btf_avx2(cospi48, &u[36], cospi16, &u[59], rnding, bit);
  u[36] = temp1;
  u[37] = temp2;
  u[38] = temp3;
  u[39] = temp4;

  temp1 = half_btf_avx2(cospim48, &u[40], cospim16, &u[55], rnding, bit);
  temp2 = half_btf_avx2(cospim48, &u[41], cospim16, &u[54], rnding, bit);
  temp3 = half_btf_avx2(cospim48, &u[42], cospim16, &u[53], rnding, bit);
  temp4 = half_btf_avx2(cospim48, &u[43], cospim16, &u[52], rnding, bit);
  u[52] = half_btf_avx2(cospim16, &u[43], cospi48, &u[52], rnding, bit);
  u[53] = half_btf_avx2(cospim16, &u[42], cospi48, &u[53], rnding, bit);
  u[54] = half_btf_avx2(cospim16, &u[41], cospi48, &u[54], rnding, bit);
  u[55] = half_btf_avx2(cospim16, &u[40], cospi48, &u[55], rnding, bit);
  u[40] = temp1;
  u[41] = temp2;
  u[42] = temp3;
  u[43] = temp4;
}